

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentPtr::CompareType(ON_SubDComponentPtr *a,ON_SubDComponentPtr *b)

{
  Type a_00;
  Type b_00;
  ON_SubDComponentPtr *b_local;
  ON_SubDComponentPtr *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a == (ON_SubDComponentPtr *)0x0) {
    a_local._4_4_ = 1;
  }
  else if (b == (ON_SubDComponentPtr *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    a_00 = ComponentType(a);
    b_00 = ComponentType(b);
    a_local._4_4_ = CompareComponentPtrType(a_00,b_00);
  }
  return a_local._4_4_;
}

Assistant:

int ON_SubDComponentPtr::CompareType(
  const ON_SubDComponentPtr* a,
  const ON_SubDComponentPtr* b
  )
{
  if ( a == b )
    return 0;
    // sort nullptrs to ends of arrays
  if ( nullptr == a )
    return 1; // nonzero b < nullptr a
  if ( nullptr == b )
    return -1; // nonzero a < nullptr b
  return ON_SubDComponentPtr::CompareComponentPtrType(a->ComponentType(), b->ComponentType());
}